

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fibonacci_heap.cpp
# Opt level: O0

FibHeap fib_heap_make(void)

{
  FibHeap heap;
  
  heap = (FibHeap)operator_new(0x18);
  memset(heap,0,0x18);
  if (heap == (FibHeap)0x0) {
    printf("Error: make FibHeap failed\n");
    heap = (FibHeap)0x0;
  }
  else {
    heap->keyNum = 0;
    heap->maxDegree = 0;
    heap->min = (_FibonacciNode *)0x0;
    heap->cons = (_FibonacciNode **)0x0;
  }
  return heap;
}

Assistant:

FibHeap fib_heap_make() {
    FibHeap heap;

    heap = new _FibonacciHeap();
    if (heap == NULL) {
        printf("Error: make FibHeap failed\n");
        return NULL;
    }

    heap->keyNum = 0;
    heap->maxDegree = 0;
    heap->min = NULL;
    heap->cons = NULL;

    return heap;
}